

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<256l,1l,1l,1,1,0,0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (con_<256L,_1L,_1L,_1,_1,_0,_0> *this,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub)

{
  tensor *ptVar1;
  resizable_tensor *in_RDI;
  rand rnd;
  long num_outputs;
  long num_inputs;
  long filt_nc;
  long filt_nr;
  undefined4 in_stack_ffffffffffffeae8;
  float in_stack_ffffffffffffeaec;
  alias_tensor *in_stack_ffffffffffffeaf0;
  alias_tensor_instance *this_00;
  longlong in_stack_ffffffffffffeaf8;
  rand *in_stack_ffffffffffffeb00;
  longlong k_;
  unsigned_long in_stack_ffffffffffffeb08;
  alias_tensor_instance local_1498 [2];
  longlong local_13f8 [44];
  size_t in_stack_ffffffffffffed68;
  tensor *in_stack_ffffffffffffed70;
  alias_tensor *in_stack_ffffffffffffed78;
  
  ptVar1 = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                         *)0x1e1c99);
  tensor::k(ptVar1);
  resizable_tensor::set_size
            (in_RDI,in_stack_ffffffffffffeb08,(longlong)in_stack_ffffffffffffeb00,
             in_stack_ffffffffffffeaf8,(longlong)in_stack_ffffffffffffeaf0);
  ::rand();
  rand::rand((rand *)&local_1498[2].super_tensor.m_k);
  randomize_parameters(&in_RDI->super_tensor,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00);
  k_._0_1_ = in_RDI[2].data_instance.host_current;
  k_._1_1_ = in_RDI[2].data_instance.device_current;
  k_._2_1_ = in_RDI[2].data_instance.have_active_transfer;
  k_._3_1_ = in_RDI[2].data_instance.device_in_use;
  k_._4_4_ = *(undefined4 *)&in_RDI[2].data_instance.field_0xc;
  ptVar1 = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
                         *)0x1e1d4e);
  tensor::k(ptVar1);
  alias_tensor::alias_tensor
            ((alias_tensor *)in_RDI,(longlong)ptVar1,k_,in_stack_ffffffffffffeaf8,
             (longlong)in_stack_ffffffffffffeaf0);
  alias_tensor::operator=
            (in_stack_ffffffffffffeaf0,
             (alias_tensor *)CONCAT44(in_stack_ffffffffffffeaec,in_stack_ffffffffffffeae8));
  alias_tensor::~alias_tensor((alias_tensor *)0x1e1da5);
  if (((ulong)in_RDI[2].data_instance.data_host.
              super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi & 1) != 0) {
    alias_tensor::alias_tensor
              ((alias_tensor *)in_RDI,(longlong)ptVar1,k_,in_stack_ffffffffffffeaf8,
               (longlong)in_stack_ffffffffffffeaf0);
    this_00 = local_1498;
    alias_tensor::operator=
              ((alias_tensor *)this_00,
               (alias_tensor *)CONCAT44(in_stack_ffffffffffffeaec,in_stack_ffffffffffffeae8));
    alias_tensor::~alias_tensor((alias_tensor *)0x1e1e0b);
    alias_tensor::size((alias_tensor *)(in_RDI + 1));
    alias_tensor::operator()
              (in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
    alias_tensor_instance::operator=(this_00,in_stack_ffffffffffffeaec);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e1e4f);
  }
  rand::~rand((rand *)&local_1498[2].super_tensor.m_k);
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            const long filt_nr = _nr!=0 ? _nr : sub.get_output().nr();
            const long filt_nc = _nc!=0 ? _nc : sub.get_output().nc();

            long num_inputs = filt_nr*filt_nc*sub.get_output().k();
            long num_outputs = num_filters_;
            // allocate params for the filters and also for the filter bias values.
            params.set_size(num_inputs*num_filters_ + static_cast<int>(use_bias) * num_filters_);

            dlib::rand rnd(std::rand());
            randomize_parameters(params, num_inputs+num_outputs, rnd);

            filters = alias_tensor(num_filters_, sub.get_output().k(), filt_nr, filt_nc);
            if (use_bias)
            {
                biases = alias_tensor(1,num_filters_);
                // set the initial bias values to zero
                biases(params,filters.size()) = 0;
            }
        }